

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_ManFindArrivalMax(Mpm_Man_t *p)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int ArrMax;
  int i;
  Mig_Obj_t *pObj;
  int *pmTimes;
  Mpm_Man_t *p_local;
  
  piVar2 = Vec_IntArray(&p->vTimes);
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(&p->pMig->vCos);
    bVar3 = false;
    if (local_24 < iVar1) {
      _ArrMax = Mig_ManCo(p->pMig,local_24);
      bVar3 = _ArrMax != (Mig_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Mig_ObjFaninId0(_ArrMax);
    local_28 = Abc_MaxInt(local_28,piVar2[iVar1]);
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

static inline int Mpm_ManFindArrivalMax( Mpm_Man_t * p )
{
    int * pmTimes = Vec_IntArray( &p->vTimes );
    Mig_Obj_t * pObj;
    int i, ArrMax = 0;
    Mig_ManForEachCo( p->pMig, pObj, i )
        ArrMax = Abc_MaxInt( ArrMax, pmTimes[ Mig_ObjFaninId0(pObj) ] );
    return ArrMax;
}